

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

void __thiscall Compressor::Impl::getPalettes(Impl *this,Image *image,int *p1,int *p2)

{
  int iVar1;
  pointer pCVar2;
  int iVar3;
  __node_base_ptr p_Var4;
  mapped_type *pmVar5;
  Color *c;
  pointer __k;
  Color p2c;
  key_type local_3c;
  _Hashtable<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_38;
  
  std::
  _Hashtable<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)this);
  local_38 = &(this->palette2)._M_h;
  std::
  _Hashtable<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(local_38);
  *p2 = 0;
  *p1 = 0;
  pCVar2 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__k = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_start; __k != pCVar2; __k = __k + 1) {
    local_3c = (key_type)((uint)*__k & 0xffffff);
    if (-1 < *p2) {
      p_Var4 = std::
               _Hashtable<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         (local_38,(ulong)(long)(int)local_3c %
                                   (this->palette2)._M_h._M_bucket_count,&local_3c,
                          (long)(int)local_3c);
      if ((p_Var4 == (__node_base_ptr)0x0) || (p_Var4->_M_nxt == (_Hash_node_base *)0x0)) {
        iVar1 = *p2;
        iVar3 = -1;
        if (iVar1 != 0x100) {
          pmVar5 = std::__detail::
                   _Map_base<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_38,&local_3c);
          *pmVar5 = (mapped_type)iVar1;
          iVar3 = *p2 + 1;
        }
        *p2 = iVar3;
      }
    }
    if (-1 < *p1) {
      p_Var4 = std::
               _Hashtable<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,(ulong)(long)(int)*__k % (this->palette1)._M_h._M_bucket_count,__k
                          ,(long)(int)*__k);
      if ((p_Var4 == (__node_base_ptr)0x0) || (p_Var4->_M_nxt == (_Hash_node_base *)0x0)) {
        iVar1 = *p1;
        iVar3 = -1;
        if (iVar1 != 0x100) {
          pmVar5 = std::__detail::
                   _Map_base<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,__k);
          *pmVar5 = (mapped_type)iVar1;
          iVar3 = *p1 + 1;
        }
        *p1 = iVar3;
      }
    }
  }
  return;
}

Assistant:

void getPalettes(const Image& image, int& p1, int& p2) {
		palette1.clear();
		palette2.clear();
		p1 = p2 = 0;
		for (const Color& c : image.colorData) {
			Color p2c = c;
			p2c.a = 0;
			if (p2 >= 0 && palette2.find(p2c) == palette2.end()) {
				if (p2 == 256) {
					p2 = -1;
				} else {
					palette2[p2c] = p2;
					p2++;
				}
			}
			if (p1 >= 0 && palette1.find(c) == palette1.end()) {
				if (p1 == 256) {
					p1 = -1;
				} else {
					palette1[c] = p1;
					p1++;
				}
			}
		}
	}